

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::RoaringAnalyzeState::RoaringAnalyzeState
          (RoaringAnalyzeState *this,CompressionInfo *info)

{
  _Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false> _Var1;
  pointer __p;
  pointer __p_00;
  long lVar2;
  uint8_t i;
  uint uVar3;
  unsafe_unique_array<BitmaskTableEntry> *result;
  uint8_t uVar4;
  ulong in_R8;
  byte bVar5;
  uint uVar6;
  __uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  local_28;
  
  (this->super_AnalyzeState).info.block_manager = info->block_manager;
  (this->super_AnalyzeState)._vptr_AnalyzeState = (_func_int **)&PTR__RoaringAnalyzeState_0279c198;
  (this->bitmask_table).
  super_unique_ptr<duckdb::roaring::BitmaskTableEntry[],_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  .super__Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false>._M_head_impl =
       (BitmaskTableEntry *)0x0;
  __p_00 = (pointer)operator_new__(0x200);
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  .super__Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false>._M_head_impl =
       (tuple<duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
        )(_Tuple_impl<0UL,_duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
          )0x0;
  ::std::
  __uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ::reset((__uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
           *)&this->bitmask_table,__p_00);
  ::std::
  unique_ptr<duckdb::roaring::BitmaskTableEntry[],_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
  ::~unique_ptr((unique_ptr<duckdb::roaring::BitmaskTableEntry[],_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
                 *)&local_28);
  lVar2 = 0;
  do {
    if (lVar2 == 0x100) {
      this->one_count = 0;
      this->zero_count = 0;
      this->run_count = 0;
      this->count = 0;
      this->data_size = 0;
      this->metadata_size = 0;
      this->segment_count = 0;
      this->current_count = 0;
      this->total_count = 0;
      this->total_size = 0;
      ContainerMetadataCollection::ContainerMetadataCollection(&this->metadata_collection);
      (this->container_metadata).
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (this->container_metadata).
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->container_metadata).
      super_vector<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      .
      super__Vector_base<duckdb::roaring::ContainerMetadata,_std::allocator<duckdb::roaring::ContainerMetadata>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      return;
    }
    _Var1._M_head_impl =
         (this->bitmask_table).
         super_unique_ptr<duckdb::roaring::BitmaskTableEntry[],_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::roaring::BitmaskTableEntry,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::roaring::BitmaskTableEntry_*,_std::default_delete<duckdb::roaring::BitmaskTableEntry[]>_>
         .super__Head_base<0UL,_duckdb::roaring::BitmaskTableEntry_*,_false>._M_head_impl;
    bVar5 = *(byte *)(_Var1._M_head_impl + lVar2) & 3;
    *(byte *)(_Var1._M_head_impl + lVar2) = bVar5;
    *(uint8_t *)((long)(_Var1._M_head_impl + lVar2) + 1) = '\0';
    uVar4 = '\0';
    for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
      uVar6 = 1 << ((byte)uVar3 & 0x1f) & (uint)lVar2;
      if ((byte)uVar3 == 7) {
        bVar5 = bVar5 & 0xfd | (uVar6 != 0) * '\x02';
        *(byte *)(_Var1._M_head_impl + lVar2) = bVar5;
LAB_014c1989:
        bVar5 = (uVar6 != 0) * '\x04' + bVar5;
        *(byte *)(_Var1._M_head_impl + lVar2) = bVar5;
        if ((~(byte)in_R8 & 1) == 0 && uVar6 == 0) {
          uVar4 = uVar4 + '\x01';
          *(uint8_t *)((long)(_Var1._M_head_impl + lVar2) + 1) = uVar4;
        }
      }
      else {
        if ((uVar3 & 0xff) != 0) goto LAB_014c1989;
        bVar5 = (uVar6 != 0) * '\x04' + (bVar5 & 0xfe | uVar6 != 0);
        *(byte *)(_Var1._M_head_impl + lVar2) = bVar5;
      }
      in_R8 = (ulong)(uVar6 != 0);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

RoaringAnalyzeState::RoaringAnalyzeState(const CompressionInfo &info)
    : AnalyzeState(info), bitmask_table(CreateBitmaskTable()) {
}